

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall module_level_html_actions::level_start(module_level_html_actions *this,int level)

{
  ostream *poVar1;
  int level_local;
  module_level_html_actions *this_local;
  
  if (level < 0x3fffffff) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  <h2 id=\'level:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    poVar1 = std::operator<<(poVar1,"\'>Level ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    std::operator<<(poVar1,"</h2>\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"  <h2>Level <em>undetermined</em></h2>\n");
  }
  this->level_ = level;
  return;
}

Assistant:

void level_start( int level )
    {
        if( level >= unknown_level )
        {
            std::cout << "  <h2>Level <em>undetermined</em></h2>\n";
        }
        else
        {
            std::cout << "  <h2 id='level:" << level << "'>Level " << level << "</h2>\n";
        }

        level_ = level;
    }